

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except-gcc.cpp
# Opt level: O0

void __thiscall
pending_exception_info::make
          (pending_exception_info *this,__cxa_eh_globals *state_in,_Unwind_Exception *exc_in,
          bool rethrow_in)

{
  undefined4 uVar1;
  bool rethrow_in_local;
  _Unwind_Exception *exc_in_local;
  __cxa_eh_globals *state_in_local;
  pending_exception_info *this_local;
  
  this->active = exc_in;
  this->rethrow = rethrow_in;
  (this->runtime_state).caughtExceptions = state_in->caughtExceptions;
  uVar1 = *(undefined4 *)&state_in->field_0xc;
  (this->runtime_state).uncaughtExceptions = state_in->uncaughtExceptions;
  *(undefined4 *)&(this->runtime_state).field_0xc = uVar1;
  state_in->caughtExceptions = (__cxa_exception *)0x0;
  state_in->uncaughtExceptions = 0;
  return;
}

Assistant:

void pending_exception_info::make(__cxa_eh_globals *state_in,
                                  _Unwind_Exception *exc_in, bool rethrow_in)
{
    active = exc_in;
    rethrow = rethrow_in;
    runtime_state = *state_in;
    /* Read and clear C++ runtime state.  */
    state_in->caughtExceptions = 0;
    state_in->uncaughtExceptions = 0;
#if CILK_LIB_DEBUG
    check();
#endif
}